

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall ON_Plane::SwapCoordinates(ON_Plane *this,int i,int j)

{
  double *pdVar1;
  undefined1 local_a0 [8];
  ON_Xform xform;
  bool rc;
  int j_local;
  int i_local;
  ON_Plane *this_local;
  
  xform.m_xform[3][3]._7_1_ = false;
  if ((((-1 < i) && (i < 3)) && (-1 < j)) && (j < 3)) {
    memcpy(local_a0,&ON_Xform::IdentityTransformation,0x80);
    pdVar1 = ON_Xform::operator[]((ON_Xform *)local_a0,i);
    pdVar1[i] = 0.0;
    pdVar1 = ON_Xform::operator[]((ON_Xform *)local_a0,j);
    pdVar1[j] = 0.0;
    pdVar1 = ON_Xform::operator[]((ON_Xform *)local_a0,i);
    pdVar1[j] = 1.0;
    pdVar1 = ON_Xform::operator[]((ON_Xform *)local_a0,j);
    pdVar1[i] = 1.0;
    xform.m_xform[3][3]._7_1_ = Transform(this,(ON_Xform *)local_a0);
  }
  return (bool)xform.m_xform[3][3]._7_1_;
}

Assistant:

bool ON_Plane::SwapCoordinates( int i, int j )
{
  bool rc = false;
  if ( 0 <= i && i < 3 && 0 <= j && j < 3 ) {
    ON_Xform xform(ON_Xform::IdentityTransformation);
    xform[i][i] = 0.0;
    xform[j][j] = 0.0;
    xform[i][j] = 1.0;
    xform[j][i] = 1.0;
    rc = Transform(xform);
  }
  return rc;
}